

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcFaceBound::~IfcFaceBound(IfcFaceBound *this)

{
  pointer pcVar1;
  
  (this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcFaceBound_0097ed70;
  *(undefined ***)&this->field_0x58 = &PTR__IfcFaceBound_0097ede8;
  *(undefined ***)
   &(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcFaceBound_0097ed98;
  *(undefined ***)
   &(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcFaceBound_0097edc0;
  pcVar1 = (this->Orientation)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->Orientation).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

IfcFaceBound() : Object("IfcFaceBound") {}